

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

void loguru::get_thread_name(char *buffer,unsigned_long_long length,bool right_align_hext_id)

{
  pthread_t pVar1;
  void *pvVar2;
  undefined8 extraout_RAX;
  Text user_msg;
  Text fail_info;
  Text str_right;
  Text str_left;
  
  if (length == 0) {
    textprintf((char *)&str_left,"%lld",0);
    textprintf((char *)&str_right,"%u",0);
    textprintf((char *)&fail_info,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","length","!=","0u",
               str_left._str,"!=",str_right._str);
    textprintf((char *)&user_msg,"Zero length buffer in get_thread_name");
    log_and_abort(0,fail_info._str,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/paulfauthmayer[P]schemeplusplus/include/loguru.cpp"
                  ,0x3d0,"%s",user_msg._str);
  }
  if (buffer != (char *)0x0) {
    pVar1 = pthread_self();
    pthread_once(&s_pthread_key_once,make_pthread_key_name);
    pvVar2 = pthread_getspecific(s_pthread_key_name);
    if (pvVar2 == (void *)0x0) {
      *buffer = '\0';
    }
    else {
      snprintf(buffer,length,"%s",pvVar2);
    }
    if (*buffer != '\0') {
      return;
    }
    if (right_align_hext_id) {
      snprintf(buffer,length,"%*X",(ulong)((int)length - 1),pVar1 & 0xffffffff);
      return;
    }
    snprintf(buffer,length,"%X",pVar1 & 0xffffffff);
    return;
  }
  get_thread_name();
  free(user_msg._str);
  free(fail_info._str);
  free(str_right._str);
  free(str_left._str);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void get_thread_name(char* buffer, unsigned long long length, bool right_align_hext_id)
	{
#ifdef _WIN32
		(void)right_align_hext_id;
#endif
		CHECK_NE_F(length, 0u, "Zero length buffer in get_thread_name");
		CHECK_NOTNULL_F(buffer, "nullptr in get_thread_name");
#if LOGURU_PTHREADS
		auto thread = pthread_self();
		#if LOGURU_PTLS_NAMES
			if (const char* name = get_thread_name_ptls()) {
				snprintf(buffer, length, "%s", name);
			} else {
				buffer[0] = 0;
			}
		#elif defined(__APPLE__) || defined(__linux__) || defined(__sun)
			pthread_getname_np(thread, buffer, length);
		#else
			buffer[0] = 0;
		#endif

		if (buffer[0] == 0) {
			#ifdef __APPLE__
				uint64_t thread_id;
				pthread_threadid_np(thread, &thread_id);
			#elif defined(__FreeBSD__)
				long thread_id;
				(void)thr_self(&thread_id);
			#elif defined(__OpenBSD__)
				unsigned thread_id = -1;
			#else
				uint64_t thread_id = thread;
			#endif
			if (right_align_hext_id) {
				snprintf(buffer, length, "%*X", static_cast<int>(length - 1), static_cast<unsigned>(thread_id));
			} else {
				snprintf(buffer, length, "%X", static_cast<unsigned>(thread_id));
			}
		}
#elif LOGURU_WINTHREADS
		if (const char* name = get_thread_name_win32()) {
			snprintf(buffer, (size_t)length, "%s", name);
		} else {
			buffer[0] = 0;
		}
#else // !LOGURU_WINTHREADS && !LOGURU_WINTHREADS
		buffer[0] = 0;
#endif

	}